

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O0

void grabForPopup(QWidget *popup)

{
  bool bVar1;
  QDebug *o;
  QLoggingCategory *in_RDI;
  long in_FS_OFFSET;
  QWidget *in_stack_00000028;
  QDebug *in_stack_00000030;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  QWidgetPrivate *in_stack_ffffffffffffffc0;
  QDebug *in_stack_ffffffffffffffc8;
  QDebug local_30;
  QDebug local_28;
  QDebug local_20;
  undefined1 *local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  char *t;
  
  t = *(char **)(in_FS_OFFSET + 0x28);
  qt_widget_private((QWidget *)0x2d447f);
  popupGrabOk = QWidgetPrivate::stealKeyboardGrab
                          (in_stack_ffffffffffffffc0,(bool)in_stack_ffffffffffffffbf);
  if (popupGrabOk) {
    qt_widget_private((QWidget *)0x2d44a6);
    popupGrabOk = QWidgetPrivate::stealMouseGrab
                            (in_stack_ffffffffffffffc0,(bool)in_stack_ffffffffffffffbf);
    if (!popupGrabOk) {
      ungrabKeyboardForPopup((QWidget *)0x2d44cd);
    }
  }
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  lcWidgetPopup();
  anon_unknown.dwarf_65a81::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),in_RDI);
  while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                           ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
    anon_unknown.dwarf_65a81::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x2d4516);
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_ffffffffffffffc0,
               (char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),
               in_stack_ffffffffffffffb4,(char *)in_RDI,(char *)0x2d452c);
    QMessageLogger::debug();
    QDebug::operator<<(in_stack_ffffffffffffffc8,t);
    QDebug::operator<<((QDebug *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       SUB81((ulong)in_RDI >> 0x38,0));
    o = QDebug::operator<<(in_stack_ffffffffffffffc8,t);
    QDebug::QDebug(&local_28,o);
    operator<<(in_stack_00000030,in_stack_00000028);
    QDebug::~QDebug(&local_20);
    QDebug::~QDebug(&local_28);
    QDebug::~QDebug(&local_30);
    local_10 = 0;
  }
  if (*(char **)(in_FS_OFFSET + 0x28) != t) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void grabForPopup(QWidget *popup)
{
    Q_ASSERT(popup->testAttribute(Qt::WA_WState_Created));
    popupGrabOk = qt_widget_private(popup)->stealKeyboardGrab(true);
    if (popupGrabOk) {
        popupGrabOk = qt_widget_private(popup)->stealMouseGrab(true);
        if (!popupGrabOk) {
            // transfer grab back to the keyboard grabber if any
            ungrabKeyboardForPopup(popup);
        }
    }
    qCDebug(lcWidgetPopup) << "grabbed mouse and keyboard?" << popupGrabOk << "for popup" << popup;
}